

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong *puVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  uVar5 = 0;
  if (dstSize < 8) {
    return 0;
  }
  if (dstSize == 8) {
    return 0;
  }
  puVar10 = (ulong *)((long)dst + (dstSize - 8));
  uVar11 = srcSize & 0xfffffffffffffffc;
  uVar7 = (uint)srcSize & 3;
  uVar9 = (ulong)uVar7;
  switch(uVar7) {
  case 0:
    puVar12 = (ulong *)dst;
    goto joined_r0x001699a2;
  case 1:
    uVar8 = 0;
    goto LAB_00169939;
  case 2:
    uVar9 = 0;
    break;
  case 3:
    bVar1 = *(byte *)((long)src + uVar11 + 2);
    uVar9 = (ulong)CTable[bVar1].val;
    uVar5 = (ulong)CTable[bVar1].nbBits;
    if (CTable[bVar1].val >> (uVar5 & 0x3f) != 0) goto LAB_00169b31;
    if (0x3f < CTable[bVar1].nbBits) goto LAB_00169b12;
  }
  bVar1 = *(byte *)((long)src + uVar11 + 1);
  if (CTable[bVar1].val >> ((ulong)CTable[bVar1].nbBits & 0x3f) == 0) {
    uVar7 = (uint)CTable[bVar1].nbBits + (int)uVar5;
    uVar8 = (ulong)uVar7;
    if (uVar7 < 0x40) {
      uVar5 = (ulong)CTable[bVar1].val << (uVar5 & 0x3f) | uVar9;
LAB_00169939:
      if (CTable[*(byte *)((long)src + uVar11)].val >>
          ((ulong)CTable[*(byte *)((long)src + uVar11)].nbBits & 0x3f) != 0) goto LAB_00169b31;
      uVar7 = (uint)CTable[*(byte *)((long)src + uVar11)].nbBits + (int)uVar8;
      if (uVar7 < 0x40) {
        if (dst <= puVar10) {
          uVar9 = (ulong)CTable[*(byte *)((long)src + uVar11)].val << (uVar8 & 0x3f) | uVar5;
          *(ulong *)dst = uVar9;
          puVar12 = (ulong *)((ulong)(uVar7 >> 3) + (long)dst);
          if (puVar10 < puVar12) {
            puVar12 = puVar10;
          }
          uVar5 = (ulong)(uVar7 & 7);
          uVar9 = uVar9 >> ((ulong)((byte)uVar7 & 0xf8) & 0x3f);
joined_r0x001699a2:
          while (uVar11 != 0) {
            bVar1 = *(byte *)((long)src + (uVar11 - 1));
            if (CTable[bVar1].val >> ((ulong)CTable[bVar1].nbBits & 0x3f) != 0) goto LAB_00169b31;
            uVar7 = (uint)CTable[bVar1].nbBits + (int)uVar5;
            if (0x3f < uVar7) goto LAB_00169b12;
            bVar2 = *(byte *)((long)src + (uVar11 - 2));
            if (CTable[bVar2].val >> ((ulong)CTable[bVar2].nbBits & 0x3f) != 0) goto LAB_00169b31;
            uVar16 = CTable[bVar2].nbBits + uVar7;
            if (0x3f < uVar16) goto LAB_00169b12;
            bVar3 = *(byte *)((long)src + (uVar11 - 3));
            if (CTable[bVar3].val >> ((ulong)CTable[bVar3].nbBits & 0x3f) != 0) goto LAB_00169b31;
            uVar15 = CTable[bVar3].nbBits + uVar16;
            if (0x3f < uVar15) goto LAB_00169b12;
            bVar4 = *(byte *)((long)src + (uVar11 - 4));
            if (CTable[bVar4].val >> ((ulong)CTable[bVar4].nbBits & 0x3f) != 0) goto LAB_00169b31;
            uVar14 = CTable[bVar4].nbBits + uVar15;
            if (0x3f < uVar14) goto LAB_00169b12;
            if (puVar10 < puVar12) goto LAB_00169b50;
            uVar11 = uVar11 - 4;
            uVar9 = (ulong)CTable[bVar4].val << ((ulong)uVar15 & 0x3f) |
                    (ulong)CTable[bVar3].val << ((ulong)uVar16 & 0x3f) |
                    (ulong)CTable[bVar2].val << ((ulong)uVar7 & 0x3f) |
                    (ulong)CTable[bVar1].val << uVar5 | uVar9;
            puVar13 = (ulong *)((ulong)(uVar14 >> 3) + (long)puVar12);
            if (puVar10 < puVar13) {
              puVar13 = puVar10;
            }
            *puVar12 = uVar9;
            uVar5 = (ulong)(uVar14 & 7);
            uVar9 = uVar9 >> ((ulong)((byte)uVar14 & 0xf8) & 0x3f);
            puVar12 = puVar13;
          }
          if (puVar12 <= puVar10) {
            uVar7 = (int)uVar5 + 1;
            puVar13 = (ulong *)((ulong)(uVar7 >> 3) + (long)puVar12);
            if (puVar10 < puVar13) {
              puVar13 = puVar10;
            }
            *puVar12 = uVar9 | 1L << uVar5;
            sVar6 = 0;
            if (puVar13 < puVar10) {
              sVar6 = (long)puVar13 - ((long)dst + ((ulong)((uVar7 & 7) == 0) - 1));
            }
            return sVar6;
          }
        }
LAB_00169b50:
        __assert_fail("bitC->ptr <= bitC->endPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
      }
    }
LAB_00169b12:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5eb,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_00169b31:
  __assert_fail("(value>>nbBits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5ea,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;
    size_t n;
    BIT_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { size_t const initErr = BIT_initCStream(&bitC, op, oend-op);
      if (HUF_isError(initErr)) return 0; }

    n = srcSize & ~3;  /* join to mod 4 */
    switch (srcSize & 3)
    {
        case 3 : HUF_encodeSymbol(&bitC, ip[n+ 2], CTable);
                 HUF_FLUSHBITS_2(&bitC);
		 /* fall-through */
        case 2 : HUF_encodeSymbol(&bitC, ip[n+ 1], CTable);
                 HUF_FLUSHBITS_1(&bitC);
		 /* fall-through */
        case 1 : HUF_encodeSymbol(&bitC, ip[n+ 0], CTable);
                 HUF_FLUSHBITS(&bitC);
		 /* fall-through */
        case 0 : /* fall-through */
        default: break;
    }

    for (; n>0; n-=4) {  /* note : n&3==0 at this stage */
        HUF_encodeSymbol(&bitC, ip[n- 1], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 2], CTable);
        HUF_FLUSHBITS_2(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 3], CTable);
        HUF_FLUSHBITS_1(&bitC);
        HUF_encodeSymbol(&bitC, ip[n- 4], CTable);
        HUF_FLUSHBITS(&bitC);
    }

    return BIT_closeCStream(&bitC);
}